

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O2

SampleInfo * __thiscall
Triangle::sampleSurface(SampleInfo *__return_storage_ptr__,Triangle *this,Sampler *sampler)

{
  vec3f *b;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  vec3f vVar5;
  vec3f vVar6;
  float local_38;
  float fStack_34;
  vec3f local_28;
  
  (*sampler->_vptr_Sampler[4])(sampler);
  b = &this->v1;
  vVar5 = operator-(&this->v2,b);
  local_28.x = extraout_XMM0_Da * vVar5.x;
  local_28.y = extraout_XMM0_Da * vVar5.y;
  local_28.z = vVar5.z * extraout_XMM0_Da;
  vVar5 = operator+(b,&local_28);
  vVar6 = operator-(&this->v3,b);
  local_38 = vVar5.x;
  fStack_34 = vVar5.y;
  fVar3 = (this->planeNormal).x;
  fVar4 = (this->planeNormal).y;
  fVar1 = (this->planeNormal).z;
  fVar2 = this->one_by_2S;
  (__return_storage_ptr__->p).x = vVar6.x * extraout_XMM0_Db + local_38;
  (__return_storage_ptr__->p).y = vVar6.y * extraout_XMM0_Db + fStack_34;
  (__return_storage_ptr__->p).z = vVar6.z * extraout_XMM0_Db + vVar5.z;
  (__return_storage_ptr__->normal).x = fVar3;
  (__return_storage_ptr__->normal).y = fVar4;
  (__return_storage_ptr__->normal).z = fVar1;
  __return_storage_ptr__->pdf = fVar2 + fVar2;
  return __return_storage_ptr__;
}

Assistant:

SampleInfo sampleSurface(Sampler& sampler) const
	{
		vec2f t = sampler.sampleUnitTriangle();
		vec3f p = v1 + t.x * (v2-v1) + t.y * (v3-v1);
		return SampleInfo(p, planeNormal, 2 * one_by_2S);
	}